

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strength_reduction_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::StrengthReductionPass::FindIntTypesAndConstants(StrengthReductionPass *this)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  uint32_t uVar4;
  IRContext *pIVar5;
  TypeManager *pTVar6;
  Instruction *pIVar7;
  undefined1 local_80 [4];
  uint32_t value;
  undefined1 local_78 [8];
  inst_iterator iter;
  Integer uint32;
  Integer int32;
  StrengthReductionPass *this_local;
  
  analysis::Integer::Integer((Integer *)&uint32.signed_,0x20,true);
  pIVar5 = Pass::context(&this->super_Pass);
  pTVar6 = IRContext::get_type_mgr(pIVar5);
  uVar2 = analysis::TypeManager::GetId(pTVar6,(Type *)&uint32.signed_);
  *(uint32_t *)&(this->super_Pass).field_0x34 = uVar2;
  analysis::Integer::Integer((Integer *)&iter,0x20,false);
  pIVar5 = Pass::context(&this->super_Pass);
  pTVar6 = IRContext::get_type_mgr(pIVar5);
  uVar2 = analysis::TypeManager::GetId(pTVar6,(Type *)&iter);
  this->uint32_type_id_ = uVar2;
  Pass::get_module(&this->super_Pass);
  Module::types_values_begin((Module *)local_78);
  while( true ) {
    Pass::get_module(&this->super_Pass);
    Module::types_values_end((Module *)local_80);
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_78,
                              (iterator_template<spvtools::opt::Instruction> *)local_80);
    if (!bVar1) break;
    pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)local_78);
    OVar3 = Instruction::opcode(pIVar7);
    if (OVar3 == OpConstant) {
      pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_78);
      uVar2 = Instruction::type_id(pIVar7);
      if (uVar2 == this->uint32_type_id_) {
        pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_78);
        uVar2 = Instruction::GetSingleWordOperand(pIVar7,2);
        if (uVar2 < 0x21) {
          pIVar7 = utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator->
                             ((iterator_template<spvtools::opt::Instruction> *)local_78);
          uVar4 = Instruction::result_id(pIVar7);
          this->constant_ids_[uVar2] = uVar4;
        }
      }
    }
    InstructionList::iterator::operator++((iterator *)local_78);
  }
  analysis::Integer::~Integer((Integer *)&iter);
  analysis::Integer::~Integer((Integer *)&uint32.signed_);
  return;
}

Assistant:

void StrengthReductionPass::FindIntTypesAndConstants() {
  analysis::Integer int32(32, true);
  int32_type_id_ = context()->get_type_mgr()->GetId(&int32);
  analysis::Integer uint32(32, false);
  uint32_type_id_ = context()->get_type_mgr()->GetId(&uint32);
  for (auto iter = get_module()->types_values_begin();
       iter != get_module()->types_values_end(); ++iter) {
    switch (iter->opcode()) {
      case spv::Op::OpConstant:
        if (iter->type_id() == uint32_type_id_) {
          uint32_t value = iter->GetSingleWordOperand(2);
          if (value <= 32) constant_ids_[value] = iter->result_id();
        }
        break;
      default:
        break;
    }
  }
}